

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O0

Token * __thiscall EOPlus::Lexer::ReadNumber(Token *__return_storage_ptr__,Lexer *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  variant local_f8;
  function<bool_(char)> local_b8;
  int local_94;
  undefined1 local_90 [4];
  int number;
  function<bool_(char)> local_40;
  char local_19;
  Lexer *pLStack_18;
  char c;
  Lexer *this_local;
  
  local_19 = '\0';
  pLStack_18 = this;
  this_local = (Lexer *)__return_storage_ptr__;
  std::function<bool(char)>::function<bool(&)(char),void>
            ((function<bool(char)> *)&local_40,ctype_digit);
  bVar2 = GetCharIf(this,&local_19,&local_40);
  std::function<bool_(char)>::~function(&local_40);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    local_94 = local_19 + -0x30;
    while( true ) {
      std::function<bool(char)>::function<bool(&)(char),void>
                ((function<bool(char)> *)&local_b8,ctype_digit);
      bVar2 = GetCharIf(this,&local_19,&local_b8);
      std::function<bool_(char)>::~function(&local_b8);
      iVar1 = local_94;
      if (!bVar2) break;
      iVar3 = std::numeric_limits<int>::max();
      if (iVar3 / 10 < iVar1) {
        local_94 = std::numeric_limits<int>::max();
      }
      local_94 = local_19 + -0x30 + local_94 * 10;
    }
    util::variant::variant(&local_f8,local_94);
    Token::Token(__return_storage_ptr__,Integer,&local_f8);
    util::variant::~variant(&local_f8);
  }
  else {
    util::variant::variant((variant *)local_90);
    Token::Token(__return_storage_ptr__,Invalid,(variant *)local_90);
    util::variant::~variant((variant *)local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::ReadNumber()
	{
		char c = '\0';

		if (!this->GetCharIf(c, ctype_digit))
			return Token();

		int number = (c - '0');

		while (this->GetCharIf(c, ctype_digit))
		{
			if (number > std::numeric_limits<int>::max() / 10)
				number = std::numeric_limits<int>::max();

			number *= 10;
			number += (c - '0');
		}

		return Token(Token::Integer, number);
	}